

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashed.h
# Opt level: O1

size_t wasm::FunctionHasher::flexibleHashFunction(Function *func,ExprHasher *customHasher)

{
  Expression *curr;
  ulong uVar1;
  size_t sVar2;
  pointer pTVar3;
  _Any_data local_58;
  code *local_48;
  hash<wasm::HeapType> local_31;
  
  uVar1 = std::hash<wasm::HeapType>::operator()(&local_31,&func->type);
  for (pTVar3 = (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_start;
      pTVar3 != (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_finish; pTVar3 = pTVar3 + 1) {
    uVar1 = uVar1 * 0x1000 + -0x61c8864680b583eb + (uVar1 >> 4) + pTVar3->id ^ uVar1;
  }
  curr = func->body;
  std::function<bool_(wasm::Expression_*,_unsigned_long_&)>::function
            ((function<bool_(wasm::Expression_*,_unsigned_long_&)> *)&local_58,customHasher);
  sVar2 = ExpressionAnalyzer::flexibleHash(curr,(ExprHasher *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return uVar1 * 0x1000 + -0x61c8864680b583eb + (uVar1 >> 4) + sVar2 ^ uVar1;
}

Assistant:

static size_t
  flexibleHashFunction(Function* func,
                       ExpressionAnalyzer::ExprHasher customHasher) {
    auto digest = hash(func->type);
    for (auto type : func->vars) {
      rehash(digest, type.getID());
    }
    hash_combine(digest,
                 ExpressionAnalyzer::flexibleHash(func->body, customHasher));
    return digest;
  }